

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O3

bool deqp::gles31::Functional::anon_unknown_0::AtomicCounterTest::checkRange
               (TestLog *log,vector<unsigned_int,_std::allocator<unsigned_int>_> *values,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *min,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *max)

{
  ostringstream *poVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  int iVar5;
  long lVar6;
  undefined1 local_1b0 [384];
  
  puVar3 = (values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((int)((ulong)((long)puVar4 - (long)puVar3) >> 2) < 1) {
    iVar5 = 0;
  }
  else {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    lVar6 = 0;
    iVar5 = 0;
    do {
      uVar2 = puVar3[lVar6];
      if ((uVar2 != 0xffffffff) &&
         (((int)uVar2 <
           (int)(min->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar6] ||
          ((int)(max->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar6] < (int)uVar2)))) {
        if (iVar5 < 0x14) {
          local_1b0._0_8_ = log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Value ",6);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," not in range [",0xf);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"].",2);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
          puVar3 = (values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          puVar4 = (values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
        }
        iVar5 = iVar5 + 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)((ulong)((long)puVar4 - (long)puVar3) >> 2));
    if (0x14 < iVar5) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Number of values not in range: ",0x1f);
      std::ostream::operator<<(poVar1,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,", displaying first 20 values.",0x1d);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      iVar5 = 1;
    }
  }
  return iVar5 == 0;
}

Assistant:

bool AtomicCounterTest::checkRange (TestLog& log, const vector<deUint32>& values, const vector<deUint32>& min, const vector<deUint32>& max)
{
	int failedCount = 0;

	DE_ASSERT(values.size() == min.size());
	DE_ASSERT(values.size() == max.size());

	for (int valueNdx = 0; valueNdx < (int)values.size(); valueNdx++)
	{
		if (values[valueNdx] != (deUint32)-1)
		{
			if (!deInRange32(values[valueNdx], min[valueNdx], max[valueNdx]))
			{
				if (failedCount < 20)
					log << TestLog::Message << "Value " << values[valueNdx] << " not in range [" << min[valueNdx] << ", " << max[valueNdx] << "]." << TestLog::EndMessage;
				failedCount++;
			}
		}
	}

	if (failedCount > 20)
		log << TestLog::Message << "Number of values not in range: " << failedCount << ", displaying first 20 values." << TestLog::EndMessage;

	return failedCount == 0;
}